

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int message_set_footer(MESSAGE_HANDLE message,annotations footer)

{
  AMQP_VALUE pAVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x39d;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x39d;
    }
    pcVar5 = "NULL message";
    iVar3 = 0x39c;
  }
  else {
    if (footer == (annotations)0x0) {
      if (message->footer == (AMQP_VALUE)0x0) {
        return 0;
      }
      amqpvalue_destroy(message->footer);
      message->footer = (annotations)0x0;
      return 0;
    }
    pAVar1 = amqpvalue_clone(footer);
    if (pAVar1 != (AMQP_VALUE)0x0) {
      if (message->footer != (AMQP_VALUE)0x0) {
        amqpvalue_destroy(message->footer);
      }
      message->footer = pAVar1;
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x3b8;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x3b8;
    }
    pcVar5 = "Cannot clone message footer";
    iVar3 = 0x3b7;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
            ,"message_set_footer",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int message_set_footer(MESSAGE_HANDLE message, annotations footer)
{
    int result;

    if (message == NULL)
    {
        /* Codes_SRS_MESSAGE_01_077: [ If `message` is NULL, `message_set_footer` shall fail and return a non-zero value. ]*/
        LogError("NULL message");
        result = MU_FAILURE;
    }
    else
    {
        if (footer == NULL)
        {
            /* Codes_SRS_MESSAGE_01_151: [ If `footer` is NULL, the previously stored footer associated with `message` shall be freed. ]*/
            if (message->footer != NULL)
            {
                annotations_destroy(message->footer);
                message->footer = NULL;
            }

            /* Codes_SRS_MESSAGE_01_076: [ On success it shall return 0. ]*/
            result = 0;
        }
        else
        {
            annotations new_footer;

            /* Codes_SRS_MESSAGE_01_075: [ `message_set_footer` shall copy the contents of `footer` as the footer contents for the message instance identified by `message`. ]*/
            /* Codes_SRS_MESSAGE_01_078: [ Cloning the footer shall be done by calling `annotations_clone`. ]*/
            new_footer = annotations_clone(footer);
            if (new_footer == NULL)
            {
                /* Codes_SRS_MESSAGE_01_079: [ If `annotations_clone` fails, `message_set_footer` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone message footer");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_080: [ If setting the footer fails, the previous value shall be preserved. ]*/
                /* Only do the free of the previous value if we could clone the new one*/
                if (message->footer != NULL)
                {
                    annotations_destroy(message->footer);
                }

                message->footer = new_footer;

                /* Codes_SRS_MESSAGE_01_076: [ On success it shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}